

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O3

void bidiag(double *A,int M,int N)

{
  size_t __size;
  double *x;
  double *v;
  long lVar1;
  double *A_00;
  double *C;
  double *pdVar2;
  int m;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int N_00;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  double alpha;
  double *local_c8;
  double *local_a0;
  double local_68;
  double *local_50;
  
  if (N <= M) {
    uVar14 = (ulong)(uint)N;
    lVar17 = (long)M;
    __size = lVar17 * 8;
    x = (double *)malloc(__size);
    v = (double *)malloc(__size);
    lVar1 = (long)N;
    A_00 = (double *)malloc(__size * lVar1);
    C = (double *)malloc(__size * lVar17);
    if (0 < N) {
      uVar10 = (ulong)(uint)M;
      lVar13 = lVar1 << 0x20;
      local_c8 = A + lVar1;
      uVar6 = 0;
      uVar9 = uVar10;
      uVar16 = uVar14;
      lVar15 = lVar13;
      local_a0 = A;
      local_50 = A;
      do {
        lVar15 = lVar15 + -0x100000000;
        iVar5 = (int)uVar6;
        if ((long)uVar6 < lVar17) {
          uVar3 = 0;
          pdVar2 = local_50;
          do {
            x[uVar3] = *pdVar2;
            uVar3 = uVar3 + 1;
            pdVar2 = pdVar2 + lVar1;
          } while (uVar9 != uVar3);
          N_00 = M - iVar5;
          local_68 = house(x,N_00,v);
          if ((long)uVar6 < lVar17) {
            lVar4 = 0;
            pdVar2 = local_a0;
            uVar3 = uVar6;
            do {
              uVar7 = 0;
              lVar11 = lVar4;
              do {
                *(double *)((long)A_00 + (lVar11 >> 0x1d)) = pdVar2[uVar7];
                lVar11 = lVar11 + (uVar9 << 0x20);
                uVar7 = uVar7 + 1;
              } while (uVar16 != uVar7);
              uVar3 = uVar3 + 1;
              lVar4 = lVar4 + 0x100000000;
              pdVar2 = pdVar2 + uVar14;
            } while (uVar3 != uVar10);
          }
        }
        else {
          N_00 = M - iVar5;
          local_68 = house(x,N_00,v);
        }
        m = N - iVar5;
        mmult(A_00,v,C,m,N_00,1);
        scale(C,N - iVar5,1,local_68);
        mmult(v,C,A_00,N_00,1,m);
        if ((long)uVar6 < lVar17) {
          lVar4 = 0;
          pdVar2 = local_50;
          uVar3 = uVar6;
          do {
            uVar7 = 0;
            lVar11 = lVar4;
            do {
              pdVar2[uVar7] = pdVar2[uVar7] - *(double *)((long)A_00 + (lVar11 >> 0x1d));
              uVar7 = uVar7 + 1;
              lVar11 = lVar11 + 0x100000000;
            } while (uVar16 != uVar7);
            uVar3 = uVar3 + 1;
            pdVar2 = pdVar2 + lVar1;
            lVar4 = lVar4 + lVar13;
          } while (uVar3 != uVar10);
        }
        uVar3 = uVar6 + 1;
        if ((long)uVar3 < lVar17) {
          uVar7 = 1;
          pdVar2 = local_c8;
          do {
            *pdVar2 = v[uVar7];
            pdVar2 = pdVar2 + lVar1;
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
        }
        if ((long)uVar6 < (long)(N + -2)) {
          lVar4 = uVar6 * (N + 1);
          memcpy(x,(void *)((lVar4 * 8 + 8U & 0x7fffffff8) + (long)A),
                 (ulong)(uint)((N + -2) - iVar5) * 8 + 8);
          alpha = house(x,(N - iVar5) + -1,v);
          lVar11 = 0;
          uVar7 = uVar6;
          pdVar2 = local_50;
          do {
            uVar8 = 1;
            lVar12 = lVar11;
            do {
              *(double *)((long)A_00 + (lVar12 >> 0x1d)) = pdVar2[uVar8];
              uVar8 = uVar8 + 1;
              lVar12 = lVar12 + 0x100000000;
            } while (uVar16 != uVar8);
            uVar7 = uVar7 + 1;
            pdVar2 = pdVar2 + lVar1;
            lVar11 = lVar11 + lVar15;
          } while (uVar7 != uVar10);
          mmult(A_00,v,C,N_00,m + -1,1);
          scale(C,N_00,1,alpha);
          mmult(C,v,A_00,N_00,1,m + -1);
          lVar11 = 0;
          pdVar2 = local_50;
          do {
            uVar7 = 1;
            lVar12 = lVar11;
            do {
              pdVar2[uVar7] = pdVar2[uVar7] - *(double *)((long)A_00 + (lVar12 >> 0x1d));
              uVar7 = uVar7 + 1;
              lVar12 = lVar12 + 0x100000000;
            } while (uVar16 != uVar7);
            uVar6 = uVar6 + 1;
            pdVar2 = pdVar2 + lVar1;
            lVar11 = lVar11 + lVar15;
          } while (uVar6 != uVar10);
          memcpy((void *)((lVar4 * 8 + 0x10U & 0x7fffffff8) + (long)A),v + 1,
                 (ulong)(uint)((N + -3) - iVar5) * 8 + 8);
        }
        uVar9 = uVar9 - 1;
        local_50 = local_50 + lVar1 + 1;
        local_a0 = local_a0 + uVar14 + 1;
        uVar16 = uVar16 - 1;
        lVar13 = lVar13 + -0x100000000;
        local_c8 = local_c8 + lVar1 + 1;
        uVar6 = uVar3;
      } while (uVar3 != uVar14);
    }
    free(x);
    free(v);
    free(A_00);
    return;
  }
  printf("M should be greater than or equal to N");
  exit(1);
}

Assistant:

void bidiag(double *A, int M, int N) {
	int j,i,k,u,t;
	double *x,*v,*AT,*w;
	double beta;

	if (M < N) {
			printf("M should be greater than or equal to N");
			exit(1);
	}
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * N);
	w = (double*) malloc(sizeof(double) * M * M);


	for(j = 0; j < N;++j) {
		for(i=j;i < M;++i) {
			x[i-j] = A[i*N+j];

		}

		beta = house(x,M-j,v);

		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = A[k+t];
				u+=(M-j);

			}

		}


		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,beta);
		mmult(v,w,AT,M-j,1,N-j);
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				A[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}

		for(i=j+1;i < M;++i) {
			A[i*N+j] = v[i-j];
		}

		if (j < N - 2) {
			for(i=j+1;i < N;++i) {
				x[i-j-1] = A[j*N+i];
			}
			beta = house(x,N-j-1,v);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					AT[u+k-j-1] = A[k+t];
				}
			}

			mmult(AT,v,w,M-j,N-j-1,1);
			scale(w,M-j,1,beta);
			mmult(w,v,AT,M-j,1,N-j-1);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					A[k+t] -= AT[u+k-j-1];
				}
			}
			u = 1;
			t = j*N;
			for(i = j + 2; i < N;++i) {
				A[t+i] = v[u];
				u++;
			}

		}

	}


	free(x);
	free(v);
	free(AT);

}